

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

_Bool player_can_refuel(player *p,_Bool show_msg)

{
  _Bool _Var1;
  object *poVar2;
  
  poVar2 = equipped_item_by_slot_name(p,"light");
  if (poVar2 == (object *)0x0) {
    if (!show_msg) {
      return false;
    }
  }
  else {
    _Var1 = flag_has_dbg(poVar2->flags,5,0x14,"obj->flags","OF_TAKES_FUEL");
    if (!show_msg || _Var1) {
      return _Var1;
    }
  }
  msg("Your light cannot be refuelled.");
  return false;
}

Assistant:

bool player_can_refuel(struct player *p, bool show_msg)
{
	struct object *obj = equipped_item_by_slot_name(p, "light");

	if (obj && of_has(obj->flags, OF_TAKES_FUEL)) {
		return true;
	}

	if (show_msg) {
		msg("Your light cannot be refuelled.");
	}

	return false;
}